

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O3

void vkt::sparse::anon_unknown_0::initProgramsDrawWithUBO
               (SourceCollections *programCollection,TestFlags flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_t sVar3;
  ProgramSources *pPVar4;
  ostream *poVar5;
  long *plVar6;
  size_type *psVar7;
  char *pcVar8;
  string valueExpr;
  ostringstream src;
  undefined1 auStack_238 [8];
  undefined8 local_230;
  value_type local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)auStack_238 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x90);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in vec4 in_position;\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"out gl_PerVertex {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    vec4 gl_Position;\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"};\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    gl_Position = in_position;\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"vert","");
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1e8);
  std::__cxx11::stringbuf::str();
  local_230 = (size_type *)((ulong)local_230._4_4_ << 0x20);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,local_208._M_dataplus._M_p,
             local_208._M_dataplus._M_p + local_208._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar4->sources + ((ulong)local_230 & 0xffffffff),&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_208.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = "ivec4(3*(ndx % nonAliasedSize) ^ 127, 0, 0, 0)";
  if ((flags & 1) == 0) {
    pcVar2 = "ivec4(3*ndx ^ 127, 0, 0, 0)";
  }
  pcVar8 = pcVar2 + 0x2e;
  if ((flags & 1) == 0) {
    pcVar8 = pcVar2 + 0x1b;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,pcVar2,pcVar8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)auStack_238 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x90);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out vec4 o_color;\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(constant_id = 1) const int dataSize  = 1;\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(constant_id = 2) const int chunkSize = 1;\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(set = 0, binding = 0, std140) uniform SparseBuffer {\n",
             0x3c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    ivec4 data[dataSize];\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"} ubo;\n",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    const int fragNdx        = int(gl_FragCoord.x) + ",0x35);
  poVar5 = (ostream *)std::ostream::operator<<(local_1a8,0x80);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," * int(gl_FragCoord.y);\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    const int pageSize       = ",0x1f);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x80);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," * ",3);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x80);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"    const int numChunks      = dataSize / chunkSize;\n",0x35);
  if ((flags & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "    const int nonAliasedSize = (numChunks > 1 ? dataSize - chunkSize : dataSize);\n"
               ,0x52);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    bool      ok             = true;\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    for (int ndx = fragNdx; ndx < dataSize; ndx += pageSize)\n",
             0x3d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    {\n",6);
  if ((~flags & 6) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"        if (ndx >= chunkSize && ndx < 2*chunkSize)\n",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"            ok = ok && (ubo.data[ndx] == ivec4(0));\n",0x34);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"        else\n",0xd);
    std::operator+(&local_208,"            ok = ok && (ubo.data[ndx] == ",&local_1e8);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_208);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar7) {
      local_228._M_string_length = *psVar7;
      local_228.field_2._M_allocated_capacity = plVar6[3];
      local_230 = &local_228._M_string_length;
    }
    else {
      local_228._M_string_length = *psVar7;
      local_230 = (size_type *)*plVar6;
    }
    local_228._M_dataplus._M_p = (pointer)plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_230,(long)local_228._M_dataplus._M_p);
    if (local_230 != &local_228._M_string_length) {
      operator_delete(local_230,local_228._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if ((flags & 2) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"        if (ndx >= chunkSize && ndx < 2*chunkSize)\n",0x33);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"            continue;\n",0x16);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"        ok = ok && (ubo.data[ndx] == ",0x25);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    if (ok)\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"        o_color = vec4(0.0, 1.0, 0.0, 1.0);\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    else\n",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"        o_color = vec4(1.0, 0.0, 0.0, 1.0);\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_208._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"frag","");
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_208);
  std::__cxx11::stringbuf::str();
  local_230 = (size_type *)CONCAT44(local_230._4_4_,1);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,local_1c8,local_1c0 + (long)local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar4->sources + ((ulong)local_230 & 0xffffffff),&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void initProgramsDrawWithUBO (vk::SourceCollections& programCollection, const TestFlags flags)
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in vec4 in_position;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    gl_Position = in_position;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		const bool			aliased				= (flags & TEST_FLAG_ALIASED) != 0;
		const bool			residency			= (flags & TEST_FLAG_RESIDENCY) != 0;
		const bool			nonResidentStrict	= (flags & TEST_FLAG_NON_RESIDENT_STRICT) != 0;
		const std::string	valueExpr			= (aliased ? "ivec4(3*(ndx % nonAliasedSize) ^ 127, 0, 0, 0)" : "ivec4(3*ndx ^ 127, 0, 0, 0)");

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< "layout(constant_id = 1) const int dataSize  = 1;\n"
			<< "layout(constant_id = 2) const int chunkSize = 1;\n"
			<< "\n"
			<< "layout(set = 0, binding = 0, std140) uniform SparseBuffer {\n"
			<< "    ivec4 data[dataSize];\n"
			<< "} ubo;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    const int fragNdx        = int(gl_FragCoord.x) + " << RENDER_SIZE << " * int(gl_FragCoord.y);\n"
			<< "    const int pageSize       = " << RENDER_SIZE << " * " << RENDER_SIZE << ";\n"
			<< "    const int numChunks      = dataSize / chunkSize;\n";

		if (aliased)
			src << "    const int nonAliasedSize = (numChunks > 1 ? dataSize - chunkSize : dataSize);\n";

		src << "    bool      ok             = true;\n"
			<< "\n"
			<< "    for (int ndx = fragNdx; ndx < dataSize; ndx += pageSize)\n"
			<< "    {\n";

		if (residency && nonResidentStrict)
		{
			src << "        if (ndx >= chunkSize && ndx < 2*chunkSize)\n"
				<< "            ok = ok && (ubo.data[ndx] == ivec4(0));\n"
				<< "        else\n"
				<< "            ok = ok && (ubo.data[ndx] == " + valueExpr + ");\n";
		}
		else if (residency)
		{
			src << "        if (ndx >= chunkSize && ndx < 2*chunkSize)\n"
				<< "            continue;\n"
				<< "        ok = ok && (ubo.data[ndx] == " << valueExpr << ");\n";
		}
		else
			src << "        ok = ok && (ubo.data[ndx] == " << valueExpr << ");\n";

		src << "    }\n"
			<< "\n"
			<< "    if (ok)\n"
			<< "        o_color = vec4(0.0, 1.0, 0.0, 1.0);\n"
			<< "    else\n"
			<< "        o_color = vec4(1.0, 0.0, 0.0, 1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}